

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptexnumber.cpp
# Opt level: O2

double log(double __x)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  string *in_RDX;
  label_idx_map *in_RSI;
  ostream *in_RDI;
  double extraout_XMM0_Qa;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  map_by_value((idx_label_map *)&local_60,in_RSI);
  for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(in_RDI,(string *)&p_Var2[1]._M_parent);
    poVar1 = std::operator<<(poVar1," -> ");
    poVar1 = std::operator<<(poVar1,in_RDX);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,'\n');
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return extraout_XMM0_Qa;
}

Assistant:

void log(std::ostream& os, const label_idx_map& labels,
         const std::string& pattern_out) {
    for (auto&& elem : map_by_value(labels)) {
        os << elem.second << " -> " << pattern_out << elem.first << '\n';
    }
}